

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::tryToParseExpressionIgnoringErrors(StructuralParser *this)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
  pcStack_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Parser.h:1176:27)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Parser.h:1176:27)>
             ::_M_manager;
  local_28._8_8_ = this;
  catchParseErrors((function<void_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> tryToParseExpressionIgnoringErrors()
    {
        pool_ptr<AST::Expression> result;
        catchParseErrors ([this, &result] { result = parseExpression(); });
        return result;
    }